

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O3

void __thiscall
IRT::PrintVisitor::Visit(PrintVisitor *this,JumpConditionalStatement *jump_conditional_statement)

{
  ofstream *poVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ostream *poVar3;
  LogicOperatorType type;
  string local_50;
  
  PrintTabs(this);
  poVar1 = &this->stream_;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"JumpConditionalStatement: ",0x1a);
  ToString_abi_cxx11_(&local_50,
                      (IRT *)(ulong)(uint)(int)(char)jump_conditional_statement->operator_type_,type
                     );
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  paVar2 = &local_50.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  PrintTabs(this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"TrueLabel: ",0xb);
  Label::ToString_abi_cxx11_(&local_50,&jump_conditional_statement->label_true_);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  PrintTabs(this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"FalseLabel: ",0xc);
  Label::ToString_abi_cxx11_(&local_50,&jump_conditional_statement->label_false_);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  this->num_tabs_ = this->num_tabs_ + 1;
  (*(jump_conditional_statement->left_operand_->super_BaseElement)._vptr_BaseElement[2])
            (jump_conditional_statement->left_operand_,this);
  (*(jump_conditional_statement->right_operand_->super_BaseElement)._vptr_BaseElement[2])
            (jump_conditional_statement->right_operand_,this);
  this->num_tabs_ = this->num_tabs_ + -1;
  return;
}

Assistant:

void PrintVisitor::Visit(JumpConditionalStatement *jump_conditional_statement) {
  PrintTabs();
  stream_ << "JumpConditionalStatement: " <<
    ToString(jump_conditional_statement->operator_type_)<< std::endl;
  PrintTabs();
  stream_ << "TrueLabel: " << jump_conditional_statement->label_true_.ToString() << std::endl;
  PrintTabs();
  stream_ << "FalseLabel: " << jump_conditional_statement->label_false_.ToString() << std::endl;
  ++num_tabs_;
  jump_conditional_statement->left_operand_->Accept(this);
  jump_conditional_statement->right_operand_->Accept(this);
  --num_tabs_;
}